

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O2

uint32_t spvtools::opt::anon_unknown_0::PerformFloatingPointOperation
                   (ConstantManager *const_mgr,Op opcode,Constant *input1,Constant *input2)

{
  Type *type;
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Constant *c;
  Instruction *this;
  float fVar6;
  float fVar7;
  FloatProxy<float> val;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  FloatProxy<double> local_70;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  type = input1->type_;
  iVar4 = (*type->_vptr_Type[0xc])(type);
  if (CONCAT44(extraout_var,iVar4) == 0) {
    __assert_fail("type->AsFloat()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x229,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformFloatingPointOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  }
  iVar4 = (*type->_vptr_Type[0xc])(type);
  iVar4 = *(int *)(CONCAT44(extraout_var_00,iVar4) + 0x24);
  if ((iVar4 != 0x20) && (iVar4 != 0x40)) {
    __assert_fail("width == 32 || width == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x22b,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformFloatingPointOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  }
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  switch(opcode) {
  case OpFAdd:
    if (iVar4 == 0x40) {
      dVar1 = analysis::Constant::GetDouble(input1);
      dVar2 = analysis::Constant::GetDouble(input2);
      local_70.data_ = (uint_type)(dVar2 + dVar1);
      break;
    }
    fVar6 = analysis::Constant::GetFloat(input1);
    fVar7 = analysis::Constant::GetFloat(input2);
    fVar7 = fVar7 + fVar6;
LAB_001e8e2b:
    local_70.data_._0_4_ = fVar7;
LAB_001e8e31:
    bVar3 = IsValidResult<float>(fVar7);
    if (!bVar3) goto LAB_001e8e8c;
    utils::FloatProxy<float>::GetWords
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
               (FloatProxy<float> *)&local_70);
    goto LAB_001e8e4c;
  default:
    __assert_fail("false && \"Unexpected operation\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x24a,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformFloatingPointOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  case OpFSub:
    if (iVar4 != 0x40) {
      fVar7 = analysis::Constant::GetFloat(input1);
      fVar6 = analysis::Constant::GetFloat(input2);
      fVar7 = fVar7 - fVar6;
      local_70.data_._0_4_ = fVar7;
      goto LAB_001e8e31;
    }
    dVar1 = analysis::Constant::GetDouble(input1);
    dVar2 = analysis::Constant::GetDouble(input2);
    local_70.data_ = (uint_type)(dVar1 - dVar2);
    break;
  case OpFMul:
    if (iVar4 != 0x40) {
      fVar6 = analysis::Constant::GetFloat(input1);
      fVar7 = analysis::Constant::GetFloat(input2);
      fVar7 = fVar7 * fVar6;
      goto LAB_001e8e2b;
    }
    dVar1 = analysis::Constant::GetDouble(input1);
    dVar2 = analysis::Constant::GetDouble(input2);
    local_70.data_ = (uint_type)(dVar2 * dVar1);
    break;
  case OpFDiv:
    bVar3 = HasZero(input2);
    uVar5 = 0;
    if (bVar3) goto LAB_001e8e8e;
    uVar5 = 0;
    if (iVar4 == 0x40) {
      dVar1 = analysis::Constant::GetDouble(input1);
      dVar2 = analysis::Constant::GetDouble(input2);
      local_70.data_ = (uint_type)(dVar1 / dVar2);
      bVar3 = IsValidResult<double>((double)local_70.data_);
      if (!bVar3) goto LAB_001e8e8e;
      utils::FloatProxy<double>::GetWords
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_70);
    }
    else {
      fVar6 = analysis::Constant::GetFloat(input1);
      fVar7 = analysis::Constant::GetFloat(input2);
      local_70.data_._0_4_ = fVar6 / fVar7;
      bVar3 = IsValidResult<float>(fVar6 / fVar7);
      if (!bVar3) goto LAB_001e8e8e;
      utils::FloatProxy<float>::GetWords
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
                 (FloatProxy<float> *)&local_70);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,&local_48);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    goto LAB_001e8e61;
  }
  bVar3 = IsValidResult<double>((double)local_70.data_);
  if (bVar3) {
    utils::FloatProxy<double>::GetWords
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_70);
LAB_001e8e4c:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,&local_48);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
LAB_001e8e61:
    c = analysis::ConstantManager::GetConstant
                  (const_mgr,type,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68);
    this = analysis::ConstantManager::GetDefiningInstruction(const_mgr,c,0,(inst_iterator *)0x0);
    uVar5 = Instruction::result_id(this);
  }
  else {
LAB_001e8e8c:
    uVar5 = 0;
  }
LAB_001e8e8e:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
  return uVar5;
}

Assistant:

uint32_t PerformFloatingPointOperation(analysis::ConstantManager* const_mgr,
                                       spv::Op opcode,
                                       const analysis::Constant* input1,
                                       const analysis::Constant* input2) {
  const analysis::Type* type = input1->type();
  assert(type->AsFloat());
  uint32_t width = type->AsFloat()->width();
  assert(width == 32 || width == 64);
  std::vector<uint32_t> words;
#define FOLD_OP(op)                                                          \
  if (width == 64) {                                                         \
    utils::FloatProxy<double> val =                                          \
        input1->GetDouble() op input2->GetDouble();                          \
    double dval = val.getAsFloat();                                          \
    if (!IsValidResult(dval)) return 0;                                      \
    words = val.GetWords();                                                  \
  } else {                                                                   \
    utils::FloatProxy<float> val = input1->GetFloat() op input2->GetFloat(); \
    float fval = val.getAsFloat();                                           \
    if (!IsValidResult(fval)) return 0;                                      \
    words = val.GetWords();                                                  \
  }                                                                          \
  static_assert(true, "require extra semicolon")
  switch (opcode) {
    case spv::Op::OpFMul:
      FOLD_OP(*);
      break;
    case spv::Op::OpFDiv:
      if (HasZero(input2)) return 0;
      FOLD_OP(/);
      break;
    case spv::Op::OpFAdd:
      FOLD_OP(+);
      break;
    case spv::Op::OpFSub:
      FOLD_OP(-);
      break;
    default:
      assert(false && "Unexpected operation");
      break;
  }
#undef FOLD_OP
  const analysis::Constant* merged_const = const_mgr->GetConstant(type, words);
  return const_mgr->GetDefiningInstruction(merged_const)->result_id();
}